

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenPackForStructField
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_prefix_ptr,
          string *code_ptr)

{
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string struct_type;
  undefined1 local_80 [8];
  string field_method;
  string field_field;
  string *code;
  string *code_prefix;
  string *code_ptr_local;
  string *code_prefix_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_method.field_2 + 8),&this->namer_,field);
  Namer::Method<flatbuffers::FieldDef>((string *)local_80,&(this->namer_).super_Namer,field);
  IdlNamer::Type_abi_cxx11_((string *)local_b0,&this->namer_,struct_def);
  if ((((field->value).type.struct_def)->fixed & 1U) == 0) {
    GenIndents_abi_cxx11_(&local_250,this,2);
    std::operator+(&local_230,&local_250,"if self.");
    std::operator+(&local_210,&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_1f0,&local_210," is not None:");
    std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    GenIndents_abi_cxx11_(&local_2f0,this,3);
    std::operator+(&local_2d0,&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_2b0,&local_2d0," = self.");
    std::operator+(&local_290,&local_2b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_270,&local_290,".Pack(builder)");
    std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    GenIndents_abi_cxx11_(&local_370,this,2);
    std::operator+(&local_350,&local_370,"if self.");
    std::operator+(&local_330,&local_350,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_310,&local_330," is not None:");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
  }
  else {
    GenIndents_abi_cxx11_(&local_130,this,2);
    std::operator+(&local_110,&local_130,"if self.");
    std::operator+(&local_f0,&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_d0,&local_f0," is not None:");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    GenIndents_abi_cxx11_(&local_1d0,this,3);
    std::operator+(&local_1b0,&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_190,&local_1b0," = self.");
    std::operator+(&local_170,&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_150,&local_170,".Pack(builder)");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  GenIndents_abi_cxx11_(&local_450,this,3);
  std::operator+(&local_430,&local_450,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::operator+(&local_410,&local_430,"Add");
  std::operator+(&local_3f0,&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::operator+(&local_3d0,&local_3f0,"(builder, ");
  std::operator+(&local_3b0,&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_390,&local_3b0,")");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(field_method.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenPackForStructField(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_prefix_ptr,
                             std::string *code_ptr) const {
    auto &code_prefix = *code_prefix_ptr;
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_type = namer_.Type(struct_def);

    if (field.value.type.struct_def->fixed) {
      // Pure struct fields need to be created along with their parent
      // structs.
      code += GenIndents(2) + "if self." + field_field + " is not None:";
      code += GenIndents(3) + field_field + " = self." + field_field +
              ".Pack(builder)";
    } else {
      // Tables need to be created before their parent structs are created.
      code_prefix += GenIndents(2) + "if self." + field_field + " is not None:";
      code_prefix += GenIndents(3) + field_field + " = self." + field_field +
                     ".Pack(builder)";
      code += GenIndents(2) + "if self." + field_field + " is not None:";
    }

    code += GenIndents(3) + struct_type + "Add" + field_method + "(builder, " +
            field_field + ")";
  }